

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,EnumValueDescriptor **args)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7d [13];
  string *local_70;
  string local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  EnumValueDescriptor **local_20;
  EnumValueDescriptor **args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_70 = &local_68;
  local_20 = args;
  args_local = (EnumValueDescriptor **)format;
  format_local = (char *)this;
  ToString_abi_cxx11_(local_70,(Formatter *)*args,(EnumValueDescriptor *)args);
  local_48 = &local_68;
  local_40 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_7d);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l,local_7d);
  io::Printer::FormatInternal(this_00,&local_38,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_7d);
  local_a0 = (string *)&local_48;
  do {
    local_a0 = local_a0 + -1;
    std::__cxx11::string::~string((string *)local_a0);
  } while (local_a0 != &local_68);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }